

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  TPZGeoBlend<pzgeom::TPZGeoLinear> *pTVar1;
  bool bVar2;
  TPZGeoEl *pTVar3;
  TPZGeoEl *in_RDX;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_RDI;
  int side;
  int64_t neighIdx;
  TPZGeoElSide neigh;
  int n;
  int i;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_00000260
  ;
  TPZGeoEl *in_stack_00000268;
  TPZGeoMesh *in_stack_00000270;
  void **in_stack_00000278;
  TPZGeoEl *in_stack_00000280;
  TPZGeoElSide *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  TPZGeoElSide *in_stack_fffffffffffffe98;
  TPZGeoMesh *in_stack_fffffffffffffea0;
  TPZGeoElSideIndex *in_stack_fffffffffffffea8;
  TPZGeoElSide *in_stack_fffffffffffffeb0;
  key_type_conflict1 *in_stack_fffffffffffffec8;
  TPZGeoElSide *in_stack_fffffffffffffed0;
  int64_t *local_d8;
  pointer_____offset_0x60___ *cp_00;
  TPZGeoElSideIndex local_b8;
  key_type_conflict1 local_a0 [3];
  _Self local_88;
  _Self local_80;
  int local_74;
  int64_t local_70;
  TPZGeoElSide local_68;
  undefined4 local_4c;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  TPZGeoEl *local_18;
  
  local_30 = 0;
  local_38 = 0x21;
  local_18 = in_RDX;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>>>
            ((TPZRegisterClassId *)in_RDI,0x21);
  cp_00 = &TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>>::VTT;
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02450dd0);
  TPZGeoEl::TPZGeoEl(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
                     in_stack_00000260);
  (in_RDI->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElRefLess_02450ab8;
  (in_RDI->super_TPZGeoLinear).super_TPZNodeRep<2,_pztopology::TPZLine>.super_TPZLine.
  super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElRefLess_02450ab8;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend
            (in_RDI,(TPZGeoBlend<pzgeom::TPZGeoLinear> *)cp_00,
             (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
             &in_RDI->fNeighbours[1].fGeoElIndex);
  local_d8 = &in_RDI[1].fNeighbours[1].fGeoElIndex;
  pTVar1 = in_RDI + 1;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex
              ((TPZGeoElSideIndex *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    local_d8 = local_d8 + 3;
  } while (local_d8 != (int64_t *)&pTVar1->field_0x88);
  local_4c = 3;
  for (local_48 = 0; local_48 < 3; local_48 = local_48 + 1) {
    TPZGeoEl::Mesh(local_18);
    TPZGeoElSide::TPZGeoElSide
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    pTVar3 = TPZGeoElSide::Element(&local_68);
    local_70 = TPZGeoEl::Index(pTVar3);
    local_74 = TPZGeoElSide::Side(&local_68);
    while( true ) {
      local_80._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           find((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
                in_stack_fffffffffffffe88,(key_type_conflict1 *)0x16808c9);
      local_88._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                     ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                       *)in_stack_fffffffffffffe88);
      bVar2 = std::operator==(&local_80,&local_88);
      if (!bVar2) break;
      TPZGeoElSide::Neighbour(in_stack_fffffffffffffe98);
      in_stack_fffffffffffffed0 = &local_68;
      in_stack_fffffffffffffec8 = local_a0;
      TPZGeoElSide::operator=
                ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1680950);
      pTVar3 = TPZGeoElSide::Element(in_stack_fffffffffffffed0);
      local_70 = TPZGeoEl::Index(pTVar3);
      local_74 = TPZGeoElSide::Side(&local_68);
    }
    in_stack_fffffffffffffea0 =
         (TPZGeoMesh *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                     *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    TPZGeoElSideIndex::TPZGeoElSideIndex
              ((TPZGeoElSideIndex *)in_stack_fffffffffffffea0,(int64_t)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe94);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)&in_RDI[1].fNeighbours[(long)local_48 + 1].fGeoElIndex,&local_b8
              );
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1680ad3);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1680ae0);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}